

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

CompilerGLSL * __thiscall
spirv_cross::CompilerGLSL::flattened_access_chain_struct_abi_cxx11_
          (CompilerGLSL *this,uint32_t base,uint32_t *indices,uint32_t count,SPIRType *target_type,
          uint32_t offset)

{
  uint uVar1;
  uint32_t id;
  size_t sVar2;
  TypedID *this_00;
  undefined4 in_register_0000000c;
  undefined4 in_register_00000034;
  Compiler *this_01;
  undefined4 in_register_0000008c;
  int in_stack_00000008;
  char *local_168;
  string local_128 [32];
  string local_108 [32];
  undefined1 local_e8 [8];
  string tmp;
  Bitset local_c8;
  uint32_t local_84;
  byte local_7d;
  uint32_t matrix_stride;
  bool need_transpose;
  SPIRType *pSStack_78;
  uint32_t member_offset;
  SPIRType *member_type;
  uint32_t i;
  undefined1 local_60 [48];
  SPIRType *target_type_local;
  size_t sStack_28;
  uint32_t count_local;
  uint32_t *indices_local;
  Compiler *pCStack_18;
  uint32_t base_local;
  CompilerGLSL *this_local;
  string *expr;
  
  local_60._40_8_ = CONCAT44(in_register_0000008c,offset);
  this_01 = (Compiler *)CONCAT44(in_register_00000034,base);
  sStack_28 = CONCAT44(in_register_0000000c,count);
  indices_local._4_4_ = (uint)indices;
  target_type_local._4_4_ = (uint)target_type;
  local_60[0x27] = '\0';
  pCStack_18 = this_01;
  this_local = this;
  ::std::__cxx11::string::string((string *)this);
  if ((this_01[2].aliased_variables.stack_storage.aligned_char[0x16] & 1U) == 0) {
    ::std::__cxx11::string::operator+=((string *)this,"{");
  }
  else {
    type_to_glsl_constructor_abi_cxx11_((CompilerGLSL *)local_60,(SPIRType *)this_01);
    ::std::__cxx11::string::operator+=((string *)this,(string *)local_60);
    ::std::__cxx11::string::~string((string *)local_60);
    ::std::__cxx11::string::operator+=((string *)this,"(");
  }
  for (member_type._0_4_ = 0; uVar1 = (uint)member_type,
      sVar2 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::size
                        ((VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_> *)
                         (local_60._40_8_ + 0x88)), uVar1 < (uint)sVar2;
      member_type._0_4_ = (uint)member_type + 1) {
    if ((uint)member_type != 0) {
      ::std::__cxx11::string::operator+=((string *)this,", ");
    }
    this_00 = (TypedID *)
              VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::operator[]
                        ((VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_> *)
                         (local_60._40_8_ + 0x88),(ulong)(uint)member_type);
    id = TypedID::operator_cast_to_unsigned_int(this_00);
    pSStack_78 = Compiler::get<spirv_cross::SPIRType>(this_01,id);
    matrix_stride =
         Compiler::type_struct_member_offset(this_01,(SPIRType *)local_60._40_8_,(uint)member_type);
    local_7d = 0;
    local_84 = 0;
    if (1 < pSStack_78->columns) {
      Compiler::combined_decoration_for_member
                (&local_c8,this_01,(SPIRType *)local_60._40_8_,(uint)member_type);
      local_7d = Bitset::get(&local_c8,4);
      Bitset::~Bitset(&local_c8);
      local_84 = Compiler::type_struct_member_matrix_stride
                           (this_01,(SPIRType *)local_60._40_8_,(uint)member_type);
    }
    flattened_access_chain_abi_cxx11_
              ((CompilerGLSL *)local_e8,base,(uint32_t *)(ulong)indices_local._4_4_,
               (uint32_t)sStack_28,(SPIRType *)(ulong)target_type_local._4_4_,(uint32_t)pSStack_78,
               in_stack_00000008 + matrix_stride,local_84,false);
    if ((local_7d & 1) == 0) {
      ::std::__cxx11::string::operator+=((string *)this,(string *)local_e8);
    }
    else {
      ::std::__cxx11::string::string(local_128,(string *)local_e8);
      (*this_01->_vptr_Compiler[0x29])(local_108,this_01,local_128,pSStack_78,0);
      ::std::__cxx11::string::operator+=((string *)this,local_108);
      ::std::__cxx11::string::~string(local_108);
      ::std::__cxx11::string::~string(local_128);
    }
    ::std::__cxx11::string::~string((string *)local_e8);
  }
  if ((this_01[2].aliased_variables.stack_storage.aligned_char[0x16] & 1U) == 0) {
    local_168 = "}";
  }
  else {
    local_168 = ")";
  }
  ::std::__cxx11::string::operator+=((string *)this,local_168);
  return this;
}

Assistant:

std::string CompilerGLSL::flattened_access_chain_struct(uint32_t base, const uint32_t *indices, uint32_t count,
                                                        const SPIRType &target_type, uint32_t offset)
{
	std::string expr;

	if (backend.can_declare_struct_inline)
	{
		expr += type_to_glsl_constructor(target_type);
		expr += "(";
	}
	else
		expr += "{";

	for (uint32_t i = 0; i < uint32_t(target_type.member_types.size()); ++i)
	{
		if (i != 0)
			expr += ", ";

		const SPIRType &member_type = get<SPIRType>(target_type.member_types[i]);
		uint32_t member_offset = type_struct_member_offset(target_type, i);

		// The access chain terminates at the struct, so we need to find matrix strides and row-major information
		// ahead of time.
		bool need_transpose = false;
		uint32_t matrix_stride = 0;
		if (member_type.columns > 1)
		{
			need_transpose = combined_decoration_for_member(target_type, i).get(DecorationRowMajor);
			matrix_stride = type_struct_member_matrix_stride(target_type, i);
		}

		auto tmp = flattened_access_chain(base, indices, count, member_type, offset + member_offset, matrix_stride,
		                                  0 /* array_stride */, need_transpose);

		// Cannot forward transpositions, so resolve them here.
		if (need_transpose)
			expr += convert_row_major_matrix(tmp, member_type, 0, false);
		else
			expr += tmp;
	}

	expr += backend.can_declare_struct_inline ? ")" : "}";

	return expr;
}